

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O1

void __thiscall
OpenMD::ReplicateVisitor::ReplicateVisitor(ReplicateVisitor *this,SimInfo *info,Vector3i *opt)

{
  Vector3i *pVVar1;
  bool bVar2;
  int iVar3;
  uint i;
  long lVar4;
  int iVar5;
  int iVar6;
  Vector3<double> local_48;
  
  (this->super_BaseVisitor).visitorName._M_dataplus._M_p =
       (pointer)&(this->super_BaseVisitor).visitorName.field_2;
  (this->super_BaseVisitor).visitorName._M_string_length = 0;
  (this->super_BaseVisitor).visitorName.field_2._M_local_buf[0] = '\0';
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__ReplicateVisitor_002bf250;
  pVVar1 = &this->replicateOpt;
  (this->dir).super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dir).super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dir).super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->info = (SimInfo *)0x0;
  *(undefined8 *)((long)&this->info + 4) = 0;
  (this->replicateOpt).super_Vector<int,_3U>.data_[1] = 0;
  (this->replicateOpt).super_Vector<int,_3U>.data_[2] = 0;
  if (pVVar1 != opt) {
    lVar4 = 0;
    do {
      (pVVar1->super_Vector<int,_3U>).data_[lVar4] = (opt->super_Vector<int,_3U>).data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  this->info = info;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_BaseVisitor).visitorName,0,
             (char *)(this->super_BaseVisitor).visitorName._M_string_length,0x26813c);
  if (-1 < (pVVar1->super_Vector<int,_3U>).data_[0]) {
    iVar3 = 0;
    do {
      if (-1 < (this->replicateOpt).super_Vector<int,_3U>.data_[1]) {
        iVar6 = 0;
        do {
          if (-1 < (this->replicateOpt).super_Vector<int,_3U>.data_[2]) {
            iVar5 = -1;
            do {
              iVar5 = iVar5 + 1;
              if ((iVar6 != 0 || iVar3 != 0) || iVar5 != 0) {
                local_48.super_Vector<double,_3U>.data_[2] = (double)iVar5;
                local_48.super_Vector<double,_3U>.data_[0] = (double)iVar3;
                local_48.super_Vector<double,_3U>.data_[1] = (double)iVar6;
                std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
                emplace_back<OpenMD::Vector3<double>>
                          ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>
                            *)&this->dir,&local_48);
              }
            } while (iVar5 < (this->replicateOpt).super_Vector<int,_3U>.data_[2]);
          }
          bVar2 = iVar6 < (this->replicateOpt).super_Vector<int,_3U>.data_[1];
          iVar6 = iVar6 + 1;
        } while (bVar2);
      }
      bVar2 = iVar3 < (pVVar1->super_Vector<int,_3U>).data_[0];
      iVar3 = iVar3 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

ReplicateVisitor::ReplicateVisitor(SimInfo* info, Vector3i opt) :
      BaseVisitor(), replicateOpt(opt) {
    this->info  = info;
    visitorName = "ReplicateVisitor";

    // generate the replicate directions
    for (int i = 0; i <= replicateOpt[0]; i++) {
      for (int j = 0; j <= replicateOpt[1]; j++) {
        for (int k = 0; k <= replicateOpt[2]; k++) {
          // skip original frame
          if (i == 0 && j == 0 && k == 0) {
            continue;
          } else {
            dir.push_back(Vector3d((RealType)i, (RealType)j, (RealType)k));
          }
        }
      }
    }
  }